

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O2

void duckdb::CurrentSchemaFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  ClientContext *context;
  ClientData *pCVar1;
  pointer this;
  CatalogSearchEntry *pCVar2;
  Value val;
  string local_70;
  Value local_50;
  
  context = ExpressionState::GetContext(state);
  pCVar1 = ClientData::Get(context);
  this = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
         ::operator->(&pCVar1->catalog_search_path);
  pCVar2 = CatalogSearchPath::GetDefault(this);
  ::std::__cxx11::string::string((string *)&local_70,(string *)&pCVar2->schema);
  Value::Value(&local_50,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  Vector::Reference(result,&local_50);
  Value::~Value(&local_50);
  return;
}

Assistant:

static void CurrentSchemaFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	Value val(ClientData::Get(state.GetContext()).catalog_search_path->GetDefault().schema);
	result.Reference(val);
}